

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O0

void __thiscall IZDeflate::send_tree(IZDeflate *this,ct_data *tree,int max_code)

{
  uint uVar1;
  int iVar2;
  int local_38;
  int local_34;
  int min_count;
  int max_count;
  int count;
  int nextlen;
  int curlen;
  int prevlen;
  int n;
  int max_code_local;
  ct_data *tree_local;
  IZDeflate *this_local;
  
  nextlen = -1;
  min_count = 0;
  local_34 = 7;
  local_38 = 4;
  if ((tree->dl).dad == 0) {
    local_34 = 0x8a;
    local_38 = 3;
  }
  max_count = (uint)(tree->dl).dad;
  for (curlen = 0; curlen <= max_code; curlen = curlen + 1) {
    uVar1 = (uint)tree[curlen + 1].dl.dad;
    iVar2 = min_count + 1;
    if ((local_34 <= iVar2) || (max_count != uVar1)) {
      if (iVar2 < local_38) {
        do {
          min_count = iVar2;
          send_bits(this,(uint)this->bl_tree[max_count].fc.freq,
                    (uint)this->bl_tree[max_count].dl.dad);
          iVar2 = min_count + -1;
        } while (min_count + -1 != 0);
      }
      else if (max_count == 0) {
        if (iVar2 < 0xb) {
          send_bits(this,(uint)this->bl_tree[0x11].fc.freq,(uint)this->bl_tree[0x11].dl.dad);
          send_bits(this,min_count + -2,3);
        }
        else {
          send_bits(this,(uint)this->bl_tree[0x12].fc.freq,(uint)this->bl_tree[0x12].dl.dad);
          send_bits(this,min_count + -10,7);
        }
      }
      else {
        if (max_count != nextlen) {
          send_bits(this,(uint)this->bl_tree[max_count].fc.freq,
                    (uint)this->bl_tree[max_count].dl.dad);
          iVar2 = min_count;
        }
        min_count = iVar2;
        send_bits(this,(uint)this->bl_tree[0x10].fc.freq,(uint)this->bl_tree[0x10].dl.dad);
        send_bits(this,min_count + -3,2);
      }
      min_count = 0;
      nextlen = max_count;
      iVar2 = min_count;
      if (uVar1 == 0) {
        local_34 = 0x8a;
        local_38 = 3;
      }
      else if (max_count == uVar1) {
        local_34 = 6;
        local_38 = 3;
      }
      else {
        local_34 = 7;
        local_38 = 4;
      }
    }
    min_count = iVar2;
    max_count = uVar1;
  }
  return;
}

Assistant:

void IZDeflate::send_tree (ct_data near *tree, int max_code)
    // ct_data near *tree; /* the tree to be scanned */
    // int max_code;       /* and its largest code of non zero frequency */
{
    int n;                     /* iterates over all tree elements */
    int prevlen = -1;          /* last emitted length */
    int curlen;                /* length of current code */
    int nextlen = tree[0].Len; /* length of next code */
    int count = 0;             /* repeat count of the current code */
    int max_count = 7;         /* max repeat count */
    int min_count = 4;         /* min repeat count */

    /* tree[max_code+1].Len = -1; */  /* guard already set */
    if (nextlen == 0) max_count = 138, min_count = 3;

    for (n = 0; n <= max_code; n++) {
        curlen = nextlen; nextlen = tree[n+1].Len;
        if (++count < max_count && curlen == nextlen) {
            continue;
        } else if (count < min_count) {
            do { send_code(curlen, bl_tree); } while (--count != 0);

        } else if (curlen != 0) {
            if (curlen != prevlen) {
                send_code(curlen, bl_tree); count--;
            }
            Assert(count >= 3 && count <= 6, " 3_6?");
            send_code(REP_3_6, bl_tree); send_bits(count-3, 2);

        } else if (count <= 10) {
            send_code(REPZ_3_10, bl_tree); send_bits(count-3, 3);

        } else {
            send_code(REPZ_11_138, bl_tree); send_bits(count-11, 7);
        }
        count = 0; prevlen = curlen;
        if (nextlen == 0) {
            max_count = 138, min_count = 3;
        } else if (curlen == nextlen) {
            max_count = 6, min_count = 3;
        } else {
            max_count = 7, min_count = 4;
        }
    }
}